

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_type.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::ValidateTensorDim(ValidationState_t *_,Instruction *inst)

{
  Instruction *pIVar1;
  bool bVar2;
  uint32_t uVar3;
  Op OVar4;
  DiagnosticStream *pDVar5;
  string local_440;
  char *local_420;
  DiagnosticStream local_418;
  ulong local_240;
  uint64_t dim_value;
  undefined1 local_230 [4];
  uint32_t max_tensor_dim;
  char *local_210;
  DiagnosticStream local_208;
  Instruction *local_30;
  Instruction *dim;
  uint dim_id;
  int dim_index;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  dim._4_4_ = 1;
  _dim_id = inst;
  inst_local = (Instruction *)_;
  dim._0_4_ = Instruction::GetOperandAs<unsigned_int>(inst,1);
  local_30 = ValidationState_t::FindDef((ValidationState_t *)inst_local,(uint)dim);
  pIVar1 = inst_local;
  if (local_30 != (Instruction *)0x0) {
    uVar3 = Instruction::type_id(local_30);
    bVar2 = ValidationState_t::IsIntScalarType((ValidationState_t *)pIVar1,uVar3);
    pIVar1 = inst_local;
    if (bVar2) {
      uVar3 = Instruction::type_id(local_30);
      uVar3 = ValidationState_t::GetBitWidth((ValidationState_t *)pIVar1,uVar3);
      if (uVar3 == 0x20) {
        dim_value._4_4_ = 5;
        bVar2 = ValidationState_t::EvalConstantValUint64
                          ((ValidationState_t *)inst_local,(uint)dim,&local_240);
        if ((bVar2) && ((local_240 == 0 || (5 < local_240)))) {
          ValidationState_t::diag
                    (&local_418,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,_dim_id);
          OVar4 = Instruction::opcode(_dim_id);
          local_420 = spvOpcodeString(OVar4);
          pDVar5 = DiagnosticStream::operator<<(&local_418,&local_420);
          pDVar5 = DiagnosticStream::operator<<(pDVar5,(char (*) [11])" Dim <id> ");
          ValidationState_t::getIdName_abi_cxx11_
                    (&local_440,(ValidationState_t *)inst_local,(uint)dim);
          pDVar5 = DiagnosticStream::operator<<(pDVar5,&local_440);
          pDVar5 = DiagnosticStream::operator<<(pDVar5,(char (*) [24])" must be between 1 and ");
          pDVar5 = DiagnosticStream::operator<<(pDVar5,(uint *)((long)&dim_value + 4));
          pDVar5 = DiagnosticStream::operator<<(pDVar5,(char (*) [2])0x565143);
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
          std::__cxx11::string::~string((string *)&local_440);
          DiagnosticStream::~DiagnosticStream(&local_418);
          return __local._4_4_;
        }
        return SPV_SUCCESS;
      }
    }
  }
  ValidationState_t::diag(&local_208,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,_dim_id);
  OVar4 = Instruction::opcode(_dim_id);
  local_210 = spvOpcodeString(OVar4);
  pDVar5 = DiagnosticStream::operator<<(&local_208,&local_210);
  pDVar5 = DiagnosticStream::operator<<(pDVar5,(char (*) [11])" Dim <id> ");
  ValidationState_t::getIdName_abi_cxx11_
            ((string *)local_230,(ValidationState_t *)inst_local,(uint)dim);
  pDVar5 = DiagnosticStream::operator<<
                     (pDVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_230);
  pDVar5 = DiagnosticStream::operator<<(pDVar5,(char (*) [26])" is not a 32-bit integer.");
  __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
  std::__cxx11::string::~string((string *)local_230);
  DiagnosticStream::~DiagnosticStream(&local_208);
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateTensorDim(ValidationState_t& _, const Instruction* inst) {
  const auto dim_index = 1;
  const auto dim_id = inst->GetOperandAs<uint32_t>(dim_index);
  const auto dim = _.FindDef(dim_id);
  if (!dim || !_.IsIntScalarType(dim->type_id()) ||
      _.GetBitWidth(dim->type_id()) != 32) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << spvOpcodeString(inst->opcode()) << " Dim <id> "
           << _.getIdName(dim_id) << " is not a 32-bit integer.";
  }

  constexpr uint32_t max_tensor_dim = 5;

  uint64_t dim_value;
  if (_.EvalConstantValUint64(dim_id, &dim_value)) {
    if (dim_value == 0 || dim_value > max_tensor_dim) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << spvOpcodeString(inst->opcode()) << " Dim <id> "
             << _.getIdName(dim_id) << " must be between 1 and "
             << max_tensor_dim << ".";
    }
  }

  return SPV_SUCCESS;
}